

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::xpath_node_set::_assign(xpath_node_set *this,const_iterator begin_,const_iterator end_)

{
  ulong uVar1;
  xpath_node *__dest;
  bad_alloc *this_00;
  xpath_node *storage;
  size_t size_;
  const_iterator end__local;
  const_iterator begin__local;
  xpath_node_set *this_local;
  
  if (end_ < begin_) {
    __assert_fail("begin_ <= end_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/pugixml.cpp"
                  ,0x27ed,"void pugi::xpath_node_set::_assign(const_iterator, const_iterator)");
  }
  uVar1 = (long)end_ - (long)begin_ >> 4;
  if (uVar1 < 2) {
    if (this->_begin != &this->_storage) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )(this->_begin);
    }
    if (begin_ != end_) {
      (this->_storage)._node._root = (begin_->_node)._root;
      (this->_storage)._attribute._attr = (begin_->_attribute)._attr;
    }
    this->_begin = &this->_storage;
    this->_end = &this->_storage + uVar1;
  }
  else {
    __dest = (xpath_node *)
             (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                       allocate)(uVar1 << 4);
    if (__dest == (xpath_node *)0x0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    memcpy(__dest,begin_,uVar1 << 4);
    if (this->_begin != &this->_storage) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )(this->_begin);
    }
    this->_begin = __dest;
    this->_end = __dest + uVar1;
  }
  return;
}

Assistant:

PUGI__FN void xpath_node_set::_assign(const_iterator begin_, const_iterator end_)
	{
		assert(begin_ <= end_);

		size_t size_ = static_cast<size_t>(end_ - begin_);

		if (size_ <= 1)
		{
			// deallocate old buffer
			if (_begin != &_storage) impl::xml_memory::deallocate(_begin);

			// use internal buffer
			if (begin_ != end_) _storage = *begin_;

			_begin = &_storage;
			_end = &_storage + size_;
		}
		else
		{
			// make heap copy
			xpath_node* storage = static_cast<xpath_node*>(impl::xml_memory::allocate(size_ * sizeof(xpath_node)));

			if (!storage)
			{
			#ifdef PUGIXML_NO_EXCEPTIONS
				return;
			#else
				throw std::bad_alloc();
			#endif
			}

			memcpy(storage, begin_, size_ * sizeof(xpath_node));
			
			// deallocate old buffer
			if (_begin != &_storage) impl::xml_memory::deallocate(_begin);

			// finalize
			_begin = storage;
			_end = storage + size_;
		}
	}